

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

result_type __thiscall
WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_25UL,_0UL,_14UL,_18UL,_17UL,_boost::random::detail::M1,_boost::random::detail::M3<-15>,_boost::random::detail::M3<10>,_boost::random::detail::M3<-11>,_boost::random::detail::M3<16>,_boost::random::detail::M2<20>,_boost::random::detail::M1,_boost::random::detail::M3<-28>,_boost::random::detail::no_tempering>,_738093167U>
::generate(WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_25UL,_0UL,_14UL,_18UL,_17UL,_boost::random::detail::M1,_boost::random::detail::M3<_15>,_boost::random::detail::M3<10>,_boost::random::detail::M3<_11>,_boost::random::detail::M3<16>,_boost::random::detail::M2<20>,_boost::random::detail::M1,_boost::random::detail::M3<_28>,_boost::random::detail::no_tempering>,_738093167U>
           *this)

{
  result_type rVar1;
  long lVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint *p;
  uint state [25];
  uint *local_80;
  uint local_78 [26];
  
  lVar2 = 0;
  do {
    auVar4._8_4_ = (int)lVar2;
    auVar4._0_8_ = lVar2;
    auVar4._12_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar5 = (auVar4 | _DAT_00126040) ^ _DAT_00126050;
    if (auVar5._4_4_ == -0x80000000 && auVar5._0_4_ < -0x7fffffe7) {
      local_78[lVar2] = 1;
      local_78[lVar2 + 1] = 1;
    }
    auVar4 = (auVar4 | _DAT_00126030) ^ _DAT_00126050;
    if (auVar4._4_4_ == -0x80000000 && auVar4._0_4_ < -0x7fffffe7) {
      local_78[lVar2 + 2] = 1;
      local_78[lVar2 + 3] = 1;
    }
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0x1c);
  local_80 = local_78;
  boost::random::
  well_engine<unsigned_int,32ul,25ul,0ul,14ul,18ul,17ul,boost::random::detail::M1,boost::random::detail::M3<-15>,boost::random::detail::M3<10>,boost::random::detail::M3<-11>,boost::random::detail::M3<16>,boost::random::detail::M2<20>,boost::random::detail::M1,boost::random::detail::M3<-28>,boost::random::detail::no_tempering>
  ::seed<unsigned_int*>
            ((well_engine<unsigned_int,32ul,25ul,0ul,14ul,18ul,17ul,boost::random::detail::M1,boost::random::detail::M3<_15>,boost::random::detail::M3<10>,boost::random::detail::M3<_11>,boost::random::detail::M3<16>,boost::random::detail::M2<20>,boost::random::detail::M1,boost::random::detail::M3<_28>,boost::random::detail::no_tempering>
              *)this,&local_80,local_78 + 0x19);
  uVar3 = 0x3b9aca01;
  do {
    rVar1 = boost::random::
            well_engine<unsigned_int,_32UL,_25UL,_0UL,_14UL,_18UL,_17UL,_boost::random::detail::M1,_boost::random::detail::M3<-15>,_boost::random::detail::M3<10>,_boost::random::detail::M3<-11>,_boost::random::detail::M3<16>,_boost::random::detail::M2<20>,_boost::random::detail::M1,_boost::random::detail::M3<-28>,_boost::random::detail::no_tempering>
            ::operator()(&this->rng);
    uVar3 = uVar3 - 1;
  } while (1 < uVar3);
  return rVar1;
}

Assistant:

result_type generate()
    {
        unsigned state[RandomNumberGenerator::state_size];
        std::uninitialized_fill_n(state, boost::size(state), 1);

        unsigned* p = state;
        rng.seed(p, boost::end(state));

        result_type x;

        int iterations = 1000000000;

        while (iterations-- > 0)
            x = rng();

        return x;
    }